

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

double GetCostStat(uint litlen,uint dist,void *context)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RDX;
  int in_ESI;
  uint in_EDI;
  int dbits;
  int dsym;
  int lbits;
  int lsym;
  SymbolStats *stats;
  undefined8 local_8;
  
  if (in_ESI == 0) {
    local_8 = *(double *)(in_RDX + 0xa00 + (ulong)in_EDI * 8);
  }
  else {
    iVar1 = ZopfliGetLengthSymbol(in_EDI);
    iVar2 = ZopfliGetLengthExtraBits(in_EDI);
    iVar3 = ZopfliGetDistSymbol(in_ESI);
    iVar4 = ZopfliGetDistExtraBits(in_ESI);
    local_8 = (double)(iVar2 + iVar4) + *(double *)(in_RDX + 0xa00 + (long)iVar1 * 8) +
              *(double *)(in_RDX + 0x1300 + (long)iVar3 * 8);
  }
  return local_8;
}

Assistant:

static double GetCostStat(unsigned litlen, unsigned dist, void* context) {
  SymbolStats* stats = (SymbolStats*)context;
  if (dist == 0) {
    return stats->ll_symbols[litlen];
  } else {
    int lsym = ZopfliGetLengthSymbol(litlen);
    int lbits = ZopfliGetLengthExtraBits(litlen);
    int dsym = ZopfliGetDistSymbol(dist);
    int dbits = ZopfliGetDistExtraBits(dist);
    return lbits + dbits + stats->ll_symbols[lsym] + stats->d_symbols[dsym];
  }
}